

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O2

void icu_63::CalendarCache::createCache(CalendarCache **cache,UErrorCode *status)

{
  CalendarCache *this;
  code *size;
  
  size = calendar_astro_cleanup;
  ucln_i18n_registerCleanup_63(UCLN_I18N_ASTRO_CALENDAR,calendar_astro_cleanup);
  if (cache == (CalendarCache **)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    this = (CalendarCache *)UMemory::operator_new((UMemory *)0x10,(size_t)size);
    if (this == (CalendarCache *)0x0) {
      *cache = (CalendarCache *)0x0;
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        return;
      }
    }
    else {
      CalendarCache(this,0x20,status);
      *cache = this;
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        return;
      }
      (*this->_vptr_CalendarCache[1])(this);
    }
    *cache = (CalendarCache *)0x0;
  }
  return;
}

Assistant:

void CalendarCache::createCache(CalendarCache** cache, UErrorCode& status) {
    ucln_i18n_registerCleanup(UCLN_I18N_ASTRO_CALENDAR, calendar_astro_cleanup);
    if(cache == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
    } else {
        *cache = new CalendarCache(32, status);
        if(U_FAILURE(status)) {
            delete *cache;
            *cache = NULL;
        }
    }
}